

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::iterate
          (GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  string local_3b8;
  MessageBuilder local_398;
  int local_214;
  undefined1 local_210 [4];
  GLint link_status;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  MessageBuilder local_1d8;
  bool local_57;
  bool local_56;
  bool local_55;
  GLenum local_54;
  bool has_vs_compiled;
  bool has_gs_compiled;
  uint uStack_50;
  bool has_fs_compiled;
  GLenum input_primitive_type;
  uint n_input_primitive_type;
  uint n_input_primitive_types;
  GLenum input_primitive_types [5];
  bool result;
  Functions *gl;
  GeometryShaderInvalidArrayedInputVariablesTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  bVar1 = true;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    _n_input_primitive_type = 0x100000000;
    input_primitive_types[0] = 10;
    input_primitive_types[1] = 4;
    input_primitive_types[2] = 0xc;
    input_primitive_type = 5;
    for (uStack_50 = 0; uStack_50 < 5; uStack_50 = uStack_50 + 1) {
      local_54 = (&n_input_primitive_type)[uStack_50];
      deinitSOs(this);
      local_55 = false;
      local_56 = false;
      local_57 = false;
      initShaderObjects(this,local_54,&local_55,&local_56,&local_57);
      if ((((local_55 & 1U) == 0) || ((local_56 & 1U) == 0)) || ((local_57 & 1U) == 0)) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1d8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_1d8,
                            (char (*) [91])
                            "One of the shaders failed to compile (but shouldn\'t have). Shaders that failed to compile:"
                           );
        local_1e0 = "FS ";
        if ((local_55 & 1U) != 0) {
          local_1e0 = "";
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1e0);
        local_1e8 = "GS ";
        if ((local_56 & 1U) != 0) {
          local_1e8 = "";
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1e8);
        local_1f0 = "VS";
        if ((local_57 & 1U) != 0) {
          local_1f0 = "";
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [26])". Input primitive type: [");
        getInputPrimitiveTypeQualifier_abi_cxx11_((string *)local_210,this,local_54);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_210);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_210);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
      }
      else {
        GVar3 = (**(code **)(lVar6 + 0x3c8))();
        this->m_po_id = GVar3;
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glCreateProgram() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x343);
        (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_fs_id);
        (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_gs_id);
        (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_vs_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glAttachShader() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x349);
        (**(code **)(lVar6 + 0xce8))(this->m_po_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x34d);
        local_214 = 0;
        (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b82,&local_214);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glGetProgramiv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x353);
        if (local_214 == 1) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_398,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_398,
                              (char (*) [52])"A PO using a malformed GS has linked successfully. ");
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(char (*) [28])"Test input primitive type: ");
          getInputPrimitiveTypeQualifier_abi_cxx11_(&local_3b8,this,local_54);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3b8);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_3b8);
          tcu::MessageBuilder::~MessageBuilder(&local_398);
          bVar1 = false;
        }
      }
    }
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
             ,0x31e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderInvalidArrayedInputVariablesTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Iterate over all valid input primitive types */
	const glw::GLenum input_primitive_types[] = { GL_POINTS, GL_LINES, GL_LINES_ADJACENCY, GL_TRIANGLES,
												  GL_TRIANGLES_ADJACENCY };
	const unsigned int n_input_primitive_types = sizeof(input_primitive_types) / sizeof(input_primitive_types[0]);

	for (unsigned int n_input_primitive_type = 0; n_input_primitive_type < n_input_primitive_types;
		 ++n_input_primitive_type)
	{
		const glw::GLenum input_primitive_type = input_primitive_types[n_input_primitive_type];

		/* Release shader objects initialized in previous iterations */
		deinitSOs();

		/* Set up shader objects */
		bool has_fs_compiled = false;
		bool has_gs_compiled = false;
		bool has_vs_compiled = false;

		initShaderObjects(input_primitive_type, &has_fs_compiled, &has_gs_compiled, &has_vs_compiled);

		if (!has_fs_compiled || !has_gs_compiled || !has_vs_compiled)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "One of the shaders failed to compile (but shouldn't have). Shaders that failed to compile:"
				<< ((!has_fs_compiled) ? "FS " : "") << ((!has_gs_compiled) ? "GS " : "")
				<< ((!has_vs_compiled) ? "VS" : "") << ". Input primitive type: ["
				<< getInputPrimitiveTypeQualifier(input_primitive_type) << "]" << tcu::TestLog::EndMessage;

			continue;
		}

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		gl.attachShader(m_po_id, m_fs_id);
		gl.attachShader(m_po_id, m_gs_id);
		gl.attachShader(m_po_id, m_vs_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A PO using a malformed GS has linked successfully. "
							   << "Test input primitive type: " << getInputPrimitiveTypeQualifier(input_primitive_type)
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all input primitive types) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}